

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CMLeaf.hpp
# Opt level: O1

void __thiscall xercesc_4_0::CMLeaf::calcFirstPos(CMLeaf *this,CMStateSet *toSet)

{
  if ((this->super_CMNode).fIsNullable == true) {
    CMStateSet::zeroBits(toSet);
    return;
  }
  CMStateSet::setBit(toSet,(ulong)this->fPosition);
  return;
}

Assistant:

inline void CMLeaf::calcFirstPos(CMStateSet& toSet) const
{
    // If we are an epsilon node, then the first pos is an empty set
    if (isNullable())
    {
        toSet.zeroBits();
        return;
    }

    // Otherwise, its just the one bit of our position
    toSet.setBit(fPosition);
}